

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialIntegerAttributeDecoder::StoreValues
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  switch((((this->super_SequentialAttributeDecoder).attribute_)->super_GeometryAttribute).data_type_
        ) {
  case DT_INT8:
    StoreTypedValues<signed_char>(this,num_values);
    break;
  case DT_UINT8:
    StoreTypedValues<unsigned_char>(this,num_values);
    break;
  case DT_INT16:
    StoreTypedValues<short>(this,num_values);
    break;
  case DT_UINT16:
    StoreTypedValues<unsigned_short>(this,num_values);
    break;
  case DT_INT32:
    StoreTypedValues<int>(this,num_values);
    break;
  case DT_UINT32:
    StoreTypedValues<unsigned_int>(this,num_values);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool SequentialIntegerAttributeDecoder::StoreValues(uint32_t num_values) {
  switch (attribute()->data_type()) {
    case DT_UINT8:
      StoreTypedValues<uint8_t>(num_values);
      break;
    case DT_INT8:
      StoreTypedValues<int8_t>(num_values);
      break;
    case DT_UINT16:
      StoreTypedValues<uint16_t>(num_values);
      break;
    case DT_INT16:
      StoreTypedValues<int16_t>(num_values);
      break;
    case DT_UINT32:
      StoreTypedValues<uint32_t>(num_values);
      break;
    case DT_INT32:
      StoreTypedValues<int32_t>(num_values);
      break;
    default:
      return false;
  }
  return true;
}